

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

int __thiscall CTPNCodeBodyBase::get_ctx_var_for_level(CTPNCodeBodyBase *this,int level,int *varnum)

{
  CTcCodeBodyCtx *ctx;
  int *varnum_local;
  int level_local;
  CTPNCodeBodyBase *this_local;
  uint local_4;
  
  if (level == 0) {
    *varnum = this->local_ctx_var_;
    local_4 = (uint)(*(ushort *)&this->field_0xb8 >> 3 & 1);
  }
  else {
    for (ctx = this->ctx_head_; ctx != (CTcCodeBodyCtx *)0x0; ctx = ctx->nxt_) {
      if (ctx->level_ == level) {
        *varnum = ctx->var_num_;
        return 1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CTPNCodeBodyBase::get_ctx_var_for_level(int level, int *varnum)
{
    /* if they want level zero, it's our local context */
    if (level == 0)
    {
        /* set the variable ID to our local context variable */
        *varnum = local_ctx_var_;

        /* return true only if we actually have a local context */
        return has_local_ctx_;
    }

    /* scan our list to see if the level is already assigned */
    for (CTcCodeBodyCtx *ctx = ctx_head_ ; ctx != 0 ; ctx = ctx->nxt_)
    {
        /* if we've already set up this level, return its variable */
        if (ctx->level_ == level)
        {
            /* set the caller's variable number */
            *varnum = ctx->var_num_;

            /* indicate that we found it */
            return TRUE;
        }
    }

    /* didn't find it */
    return FALSE;
}